

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O0

uint8_t * LPCMStreamReader::findSubstr(char *pattern,uint8_t *buff,uint8_t *end)

{
  size_t sVar1;
  ulong local_40;
  size_t j;
  uint8_t *curPos;
  size_t patternLen;
  uint8_t *end_local;
  uint8_t *buff_local;
  char *pattern_local;
  
  sVar1 = strlen(pattern);
  j = (size_t)buff;
  do {
    if ((long)end - sVar1 <= j) {
      return (uint8_t *)0x0;
    }
    for (local_40 = 0; (local_40 < sVar1 && (*(char *)(j + local_40) == pattern[local_40]));
        local_40 = local_40 + 1) {
      if (local_40 == sVar1 - 1) {
        return (uint8_t *)j;
      }
    }
    j = j + 1;
  } while( true );
}

Assistant:

uint8_t* LPCMStreamReader::findSubstr(const char* pattern, uint8_t* buff, const uint8_t* end)
{
    const size_t patternLen = strlen(pattern);
    for (uint8_t* curPos = buff; curPos < end - patternLen; curPos++)
    {
        for (size_t j = 0; j < patternLen; j++)
        {
            if (curPos[j] != static_cast<uint8_t>(pattern[j]))
                break;
            if (j == patternLen - 1)
                return curPos;
        }
    }
    return nullptr;
}